

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O0

size_t fs_to_winpath(char *path,char *result,size_t buffer_size)

{
  size_type sVar1;
  string_view local_60;
  string local_50;
  __sv_type local_30;
  size_t local_20;
  size_t buffer_size_local;
  char *result_local;
  char *path_local;
  
  local_20 = buffer_size;
  buffer_size_local = (size_t)result;
  result_local = path;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,path);
  fs_to_winpath_abi_cxx11_(&local_50,local_60);
  local_30 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  sVar1 = fs_str2char(local_30,(char *)buffer_size_local,local_20);
  std::__cxx11::string::~string((string *)&local_50);
  return sVar1;
}

Assistant:

size_t fs_to_winpath(const char* path, char* result, const size_t buffer_size){
  return fs_str2char(fs_to_winpath(path), result, buffer_size);
}